

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O3

rnnbitfield * copybitfield(rnnbitfield *bf,char *file)

{
  int iVar1;
  rnnbitfield *prVar2;
  char *pcVar3;
  
  prVar2 = (rnnbitfield *)calloc(0xe8,1);
  pcVar3 = strdup(bf->name);
  prVar2->name = pcVar3;
  iVar1 = bf->high;
  prVar2->low = bf->low;
  prVar2->high = iVar1;
  copyvarinfo(&prVar2->varinfo,&bf->varinfo);
  prVar2->file = file;
  copytypeinfo(&prVar2->typeinfo,&bf->typeinfo,file);
  return prVar2;
}

Assistant:

static struct rnnbitfield *copybitfield (struct rnnbitfield *bf, char *file) {
	struct rnnbitfield *res = calloc (sizeof *res, 1);
	res->name = strdup(bf->name);
	res->low = bf->low;
	res->high = bf->high;
	copyvarinfo(&res->varinfo, &bf->varinfo);
	res->file = file;
	copytypeinfo(&res->typeinfo, &bf->typeinfo, file);
	return res;
}